

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O3

void __thiscall
wallet::DescriptorScriptPubKeyMan::UpgradeDescriptorCache(DescriptorScriptPubKeyMan *this)

{
  DescriptorCache *this_00;
  _Rb_tree_header *p_Var1;
  WalletStorage *pWVar2;
  element_type *peVar3;
  _Base_ptr p_Var4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  runtime_error *prVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  long in_FS_OFFSET;
  DescriptorCache diff;
  DescriptorCache temp_cache;
  vector<CScript,_std::allocator<CScript>_> scripts_temp;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock79;
  FlatSigningProvider out_keys;
  DescriptorCache DStack_3e8;
  DescriptorCache local_340;
  vector<CScript,_std::allocator<CScript>_> local_298;
  unique_lock<std::recursive_mutex> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_268;
  uint256 local_248;
  undefined **local_228;
  undefined1 local_220 [8];
  _Base_ptr local_218;
  _Base_ptr local_210;
  _Base_ptr p_Stack_208;
  _Base_ptr local_200;
  size_t local_1f8;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  local_1f0;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  local_1c0;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_190;
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  _Stack_160;
  undefined1 local_130 [16];
  _Rb_tree_node_base local_120;
  __node_base_ptr local_100;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  local_f8;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  local_c8;
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  local_98;
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  _Stack_68;
  long local_38;
  undefined4 extraout_var;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_278._M_device = &(this->cs_desc_man).super_recursive_mutex;
  local_278._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_278);
  iVar6 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[10])();
  if ((char)iVar6 == '\0') {
    pWVar2 = (this->super_ScriptPubKeyMan).m_storage;
    iVar6 = (*pWVar2->_vptr_WalletStorage[4])(pWVar2,4);
    if ((char)iVar6 == '\0') {
      this_00 = &(this->m_wallet_descriptor).cache;
      DescriptorCache::GetCachedLastHardenedExtPubKeys((ExtPubKeyMap *)local_130,this_00);
      p_Var4 = local_120._M_parent;
      std::
      _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)local_130);
      if (p_Var4 == (_Base_ptr)0x0) {
        local_120._M_left = &local_120;
        local_130._0_8_ = &PTR__FlatSigningProvider_013beda8;
        local_120._M_color = _S_red;
        local_120._M_parent = (_Base_ptr)0x0;
        local_100 = (__node_base_ptr)0x0;
        local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_f8._M_impl.super__Rb_tree_header._M_header;
        local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_c8._M_impl.super__Rb_tree_header._M_header;
        local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
        p_Var1 = &local_98._M_impl.super__Rb_tree_header;
        local_98._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_98._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_98._M_impl.super__Rb_tree_header._M_node_count = 0;
        _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left =
             &_Stack_68._M_impl.super__Rb_tree_header._M_header;
        _Stack_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        _Stack_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        _Stack_68._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_120._M_right = local_120._M_left;
        local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
        local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
             local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
        local_98._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        local_98._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        _Stack_68._M_impl.super__Rb_tree_header._M_header._M_right =
             _Stack_68._M_impl.super__Rb_tree_header._M_header._M_left;
        GetKeys((map<CKeyID,_CKey,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                 *)&local_228,this);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
        ::clear(&local_98);
        if (local_218 != (_Base_ptr)0x0) {
          local_98._M_impl.super__Rb_tree_header._M_header._M_color = local_220._0_4_;
          local_98._M_impl.super__Rb_tree_header._M_header._M_parent = local_218;
          local_98._M_impl.super__Rb_tree_header._M_header._M_left = local_210;
          local_98._M_impl.super__Rb_tree_header._M_header._M_right = p_Stack_208;
          local_218->_M_parent = &p_Var1->_M_header;
          local_98._M_impl.super__Rb_tree_header._M_node_count = (size_t)local_200;
          local_218 = (_Base_ptr)0x0;
          local_200 = (_Base_ptr)0x0;
          local_210 = (_Base_ptr)local_220;
          p_Stack_208 = (_Base_ptr)local_220;
        }
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
        ::~_Rb_tree((_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                     *)&local_228);
        local_228 = &PTR__FlatSigningProvider_013beda8;
        p_Stack_208 = (_Base_ptr)&local_218;
        local_218 = (_Base_ptr)((ulong)local_218 & 0xffffffff00000000);
        local_210 = (_Base_ptr)0x0;
        local_1f8 = 0;
        local_1f0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_1f0._M_impl.super__Rb_tree_header._M_header;
        local_1f0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_1f0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_1f0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_1c0._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_1c0._M_impl.super__Rb_tree_header._M_header;
        local_1c0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_1c0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_1c0._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_190._M_impl.super__Rb_tree_header._M_header._M_left =
             &local_190._M_impl.super__Rb_tree_header._M_header;
        local_190._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        local_190._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        local_190._M_impl.super__Rb_tree_header._M_node_count = 0;
        _Stack_160._M_impl.super__Rb_tree_header._M_header._M_left =
             &_Stack_160._M_impl.super__Rb_tree_header._M_header;
        _Stack_160._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        _Stack_160._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        _Stack_160._M_impl.super__Rb_tree_header._M_node_count = 0;
        local_298.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_298.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_298.super__Vector_base<CScript,_std::allocator<CScript>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_340.m_derived_xpubs._M_h._M_buckets = &local_340.m_derived_xpubs._M_h._M_single_bucket
        ;
        local_340.m_derived_xpubs._M_h._M_bucket_count = 1;
        local_340.m_derived_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_340.m_derived_xpubs._M_h._M_element_count = 0;
        local_340.m_derived_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_340.m_derived_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
        local_340.m_derived_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_340.m_parent_xpubs._M_h._M_buckets = &local_340.m_parent_xpubs._M_h._M_single_bucket;
        local_340.m_parent_xpubs._M_h._M_bucket_count = 1;
        local_340.m_parent_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_340.m_parent_xpubs._M_h._M_element_count = 0;
        local_340.m_parent_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_340.m_parent_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
        local_340.m_parent_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
        local_340.m_last_hardened_xpubs._M_h._M_buckets =
             &local_340.m_last_hardened_xpubs._M_h._M_single_bucket;
        local_340.m_last_hardened_xpubs._M_h._M_bucket_count = 1;
        local_340.m_last_hardened_xpubs._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        local_340.m_last_hardened_xpubs._M_h._M_element_count = 0;
        local_340.m_last_hardened_xpubs._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        local_340.m_last_hardened_xpubs._M_h._M_rehash_policy._M_next_resize = 0;
        local_340.m_last_hardened_xpubs._M_h._M_single_bucket = (__node_base_ptr)0x0;
        peVar3 = (this->m_wallet_descriptor).descriptor.
                 super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_200 = p_Stack_208;
        local_1f0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_1f0._M_impl.super__Rb_tree_header._M_header._M_left;
        local_1c0._M_impl.super__Rb_tree_header._M_header._M_right =
             local_1c0._M_impl.super__Rb_tree_header._M_header._M_left;
        local_190._M_impl.super__Rb_tree_header._M_header._M_right =
             local_190._M_impl.super__Rb_tree_header._M_header._M_left;
        _Stack_160._M_impl.super__Rb_tree_header._M_header._M_right =
             _Stack_160._M_impl.super__Rb_tree_header._M_header._M_left;
        iVar6 = (*peVar3->_vptr_Descriptor[8])
                          (peVar3,0,local_130,&local_298,
                           (_Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
                            *)&local_228);
        if ((char)iVar6 == '\0') {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(prVar8,"Unable to expand descriptor");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00bfb2dc;
        }
        DescriptorCache::MergeAndDiff(&DStack_3e8,this_00,&local_340);
        iVar6 = (*((this->super_ScriptPubKeyMan).m_storage)->_vptr_WalletStorage[3])();
        plVar7 = (long *)CONCAT44(extraout_var,iVar6);
        (**(code **)(*plVar7 + 0x70))(&local_268,plVar7,1);
        local_268._M_string_length = (size_type)plVar7;
        (*(this->super_ScriptPubKeyMan)._vptr_ScriptPubKeyMan[0x1a])(&local_248,this);
        bVar5 = WalletBatch::WriteDescriptorCacheItems
                          ((WalletBatch *)&local_268,&local_248,&DStack_3e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p !=
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)0x0) {
          (**(code **)(*(size_type *)local_268._M_dataplus._M_p + 0x28))();
        }
        if (!bVar5) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_268,"UpgradeDescriptorCache","");
          pbVar9 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                   append(&local_268,": writing cache items failed");
          local_248.super_base_blob<256U>.m_data._M_elems._0_8_ = (pbVar9->_M_dataplus)._M_p;
          paVar10 = &pbVar9->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248.super_base_blob<256U>.m_data._M_elems._0_8_ == paVar10) {
            local_248.super_base_blob<256U>.m_data._M_elems._16_8_ = paVar10->_M_allocated_capacity;
            local_248.super_base_blob<256U>.m_data._M_elems._24_8_ =
                 *(undefined8 *)((long)&pbVar9->field_2 + 8);
            local_248.super_base_blob<256U>.m_data._M_elems._0_8_ =
                 local_248.super_base_blob<256U>.m_data._M_elems + 0x10;
          }
          else {
            local_248.super_base_blob<256U>.m_data._M_elems._16_8_ = paVar10->_M_allocated_capacity;
          }
          local_248.super_base_blob<256U>.m_data._M_elems._8_8_ = pbVar9->_M_string_length;
          (pbVar9->_M_dataplus)._M_p = (pointer)paVar10;
          pbVar9->_M_string_length = 0;
          (pbVar9->field_2)._M_local_buf[0] = '\0';
          std::runtime_error::runtime_error(prVar8,(string *)&local_248);
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
          goto LAB_00bfb2dc;
        }
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&DStack_3e8.m_last_hardened_xpubs._M_h);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&DStack_3e8.m_parent_xpubs._M_h);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&DStack_3e8);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_340.m_last_hardened_xpubs._M_h);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_CExtPubKey>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable(&local_340.m_parent_xpubs._M_h);
        std::
        _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
        ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::unordered_map<unsigned_int,_CExtPubKey,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_CExtPubKey>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                       *)&local_340);
        std::vector<CScript,_std::allocator<CScript>_>::~vector(&local_298);
        std::
        _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
        ::~_Rb_tree(&_Stack_160);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
        ::~_Rb_tree(&local_190);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
        ::~_Rb_tree(&local_1c0);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
        ::~_Rb_tree(&local_1f0);
        std::
        _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
        ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                     *)local_220);
        std::
        _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
        ::~_Rb_tree(&_Stack_68);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
        ::~_Rb_tree(&local_98);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
        ::~_Rb_tree(&local_c8);
        std::
        _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
        ::~_Rb_tree(&local_f8);
        std::
        _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
        ::~_Rb_tree((_Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
                     *)(local_130 + 8));
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_278);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_00bfb2dc:
  __stack_chk_fail();
}

Assistant:

void DescriptorScriptPubKeyMan::UpgradeDescriptorCache()
{
    LOCK(cs_desc_man);
    if (m_storage.IsLocked() || m_storage.IsWalletFlagSet(WALLET_FLAG_LAST_HARDENED_XPUB_CACHED)) {
        return;
    }

    // Skip if we have the last hardened xpub cache
    if (m_wallet_descriptor.cache.GetCachedLastHardenedExtPubKeys().size() > 0) {
        return;
    }

    // Expand the descriptor
    FlatSigningProvider provider;
    provider.keys = GetKeys();
    FlatSigningProvider out_keys;
    std::vector<CScript> scripts_temp;
    DescriptorCache temp_cache;
    if (!m_wallet_descriptor.descriptor->Expand(0, provider, scripts_temp, out_keys, &temp_cache)){
        throw std::runtime_error("Unable to expand descriptor");
    }

    // Cache the last hardened xpubs
    DescriptorCache diff = m_wallet_descriptor.cache.MergeAndDiff(temp_cache);
    if (!WalletBatch(m_storage.GetDatabase()).WriteDescriptorCacheItems(GetID(), diff)) {
        throw std::runtime_error(std::string(__func__) + ": writing cache items failed");
    }
}